

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_string.hpp
# Opt level: O0

string * iutest::detail::ToHexString<wchar_t>
                   (string *__return_storage_ptr__,wchar_t *str,int length)

{
  bool bVar1;
  string local_48;
  int local_24;
  undefined1 local_1d;
  int i;
  wchar_t *pwStack_18;
  int length_local;
  wchar_t *str_local;
  string *r;
  
  local_1d = 0;
  i = length;
  pwStack_18 = str;
  str_local = (wchar_t *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_24 = 0;
  while( true ) {
    if ((i < 0) || (bVar1 = false, local_24 < i)) {
      bVar1 = *pwStack_18 != L'\0';
    }
    if (!bVar1) break;
    ToHexString<wchar_t>(&local_48,*pwStack_18);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    pwStack_18 = pwStack_18 + 1;
    local_24 = local_24 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string ToHexString(const T* str, int length)
{
    ::std::string r;
    for( int i=0; (length < 0 || i < length) && *str != 0; ++str, ++i)
    {
        r += ToHexString(*str);
    }
    return r;
}